

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O0

void * HPDF_MemSet(void *s,HPDF_BYTE c,HPDF_UINT n)

{
  HPDF_BYTE *local_20;
  HPDF_BYTE *b;
  HPDF_UINT n_local;
  HPDF_BYTE c_local;
  void *s_local;
  
  local_20 = (HPDF_BYTE *)s;
  for (b._0_4_ = n; (HPDF_UINT)b != 0; b._0_4_ = (HPDF_UINT)b - 1) {
    *local_20 = c;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

void*
HPDF_MemSet  (void        *s,
              HPDF_BYTE    c,
              HPDF_UINT    n)
{
    HPDF_BYTE* b = (HPDF_BYTE*)s;

    while (n > 0) {
        *b = c;
        b++;
        n--;
    }

    return b;
}